

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ribbon_artist.cpp
# Opt level: O0

RibbonArtist * __thiscall polyscope::RibbonArtist::setMaterial(RibbonArtist *this,string *mat)

{
  bool bVar1;
  RibbonArtist *in_RDI;
  string *in_stack_000000d0;
  ShaderProgram *in_stack_000000d8;
  Engine *in_stack_000000e0;
  __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffffe0;
  
  PersistentValue<std::__cxx11::string>::operator=
            ((PersistentValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this,mat);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->program);
  if (bVar1) {
    std::
    __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator*(in_stack_ffffffffffffffe0);
    PersistentValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::get(&in_RDI->material);
    render::Engine::setMaterial(in_stack_000000e0,in_stack_000000d8,in_stack_000000d0);
    requestRedraw();
  }
  return in_RDI;
}

Assistant:

RibbonArtist* RibbonArtist::setMaterial(std::string mat) {
  material = mat;
  if (program) {
    render::engine->setMaterial(*program, material.get());
    requestRedraw();
  }
  return this;
}